

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O2

__string_type *
qclab::qasm1<float>(__string_type *__return_storage_ptr__,char *type,int qubit,float angle)

{
  ostream *poVar1;
  char *this;
  stringstream stream;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,type);
  this = "(";
  poVar1 = std::operator<<(poVar1,"(");
  qasm_abi_cxx11_(&local_1c0,(qclab *)this,angle);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,") q[");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,qubit);
  std::operator<<(poVar1,"];\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm1( const char type[] , const int qubit , const T angle ) {
    std::stringstream stream ;
    stream << type << "(" << qasm( angle ) << ") q[" << qubit << "];\n" ;
    return stream.str() ;
  }